

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

IndirOpnd * __thiscall IR::IndirOpnd::CloneUseInternal(IndirOpnd *this,Func *func)

{
  byte bVar1;
  undefined1 uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  IndirOpnd *pIVar7;
  
  if ((this->super_Opnd).m_kind != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xa42,"(m_kind == OpndKindIndir)","m_kind == OpndKindIndir");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (this->m_baseOpnd == (RegOpnd *)0x0) {
    baseOpnd = (RegOpnd *)0x0;
  }
  else {
    pOVar6 = Opnd::CloneUse(&this->m_baseOpnd->super_Opnd,func);
    baseOpnd = Opnd::AsRegOpnd(pOVar6);
  }
  if (this->m_indexOpnd == (RegOpnd *)0x0) {
    indexOpnd = (RegOpnd *)0x0;
  }
  else {
    pOVar6 = Opnd::CloneUse(&this->m_indexOpnd->super_Opnd,func);
    indexOpnd = Opnd::AsRegOpnd(pOVar6);
  }
  bVar1 = this->m_scale;
  pIVar7 = New(baseOpnd,indexOpnd,(this->super_Opnd).m_type,func);
  pIVar7->m_scale = bVar1;
  uVar2 = (this->super_Opnd).field_0xe;
  pIVar7->m_offset = this->m_offset;
  (pIVar7->super_Opnd).field_0xe = uVar2;
  pIVar7->m_addrKind = this->m_addrKind;
  pIVar7->m_originalAddress = this->m_originalAddress;
  return pIVar7;
}

Assistant:

IndirOpnd *
IndirOpnd::CloneUseInternal(Func *func)
{
    Assert(m_kind == OpndKindIndir);
    IndirOpnd * newOpnd;

    RegOpnd * newBaseOpnd = m_baseOpnd ? m_baseOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    RegOpnd * newIndexOpnd = m_indexOpnd ? m_indexOpnd->CloneUse(func)->AsRegOpnd() : nullptr;
    newOpnd = IndirOpnd::New(newBaseOpnd, newIndexOpnd, m_scale, m_type, func);

    newOpnd->SetOffset(m_offset, m_dontEncode);

#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
    newOpnd->m_originalAddress = m_originalAddress;
#endif
    return newOpnd;
}